

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

void set_str(uchar *p,char *s,size_t l,char f,char *map)

{
  size_t sVar1;
  undefined7 in_register_00000009;
  char *pcVar2;
  byte bVar3;
  byte bVar4;
  
  pcVar2 = "";
  if (s != (char *)0x0) {
    pcVar2 = s;
  }
  sVar1 = 0;
  while( true ) {
    bVar3 = pcVar2[sVar1];
    if (((ulong)bVar3 == 0) || (l == sVar1)) break;
    if ((((char)bVar3 < '\0') ||
        (*(char *)(CONCAT71(in_register_00000009,f) + (ulong)bVar3) == '\0')) &&
       (bVar4 = bVar3 + 0x9f, bVar3 = bVar3 - 0x20, 0x19 < bVar4)) {
      bVar3 = 0x5f;
    }
    p[sVar1] = bVar3;
    sVar1 = sVar1 + 1;
  }
  if (l - sVar1 != 0) {
    memset(p + sVar1,0x20,l - sVar1);
    return;
  }
  return;
}

Assistant:

static void
set_str(unsigned char *p, const char *s, size_t l, char f, const char *map)
{
	unsigned char c;

	if (s == NULL)
		s = "";
	while ((c = *s++) != 0 && l > 0) {
		if (c >= 0x80 || map[c] == 0)
		 {
			/* illegal character */
			if (c >= 'a' && c <= 'z') {
				/* convert c from a-z to A-Z */
				c -= 0x20;
			} else
				c = 0x5f;
		}
		*p++ = c;
		l--;
	}
	/* If l isn't zero, fill p buffer by the character
	 * which indicated by f. */
	if (l > 0)
		memset(p , f, l);
}